

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O1

int ipc_listener_set(void *arg,char *name,void *buf,size_t sz,nni_type t)

{
  int iVar1;
  
  iVar1 = nni_setopt(ipc_ep_options,name,arg,buf,sz,t);
  if (iVar1 == 9) {
    iVar1 = nni_stream_listener_set(*(nng_stream_listener **)((long)arg + 0x40),name,buf,sz,t);
    return iVar1;
  }
  return iVar1;
}

Assistant:

static int
ipc_listener_set(
    void *arg, const char *name, const void *buf, size_t sz, nni_type t)
{
	ipc_ep *ep = arg;
	int     rv;

	rv = nni_setopt(ipc_ep_options, name, ep, buf, sz, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_stream_listener_set(ep->listener, name, buf, sz, t);
	}
	return (rv);
}